

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O2

InterchangeObject * ASDCP::MXF::CreateObject(Dictionary *Dict,UL *label)

{
  iterator iVar1;
  InterchangeObject *pIVar2;
  
  if (s_TypesInit == '\0') {
    pthread_mutex_lock((pthread_mutex_t *)&s_InitLock);
    if (s_TypesInit == '\0') {
      Metadata_InitTypes(Dict);
      s_TypesInit = '\x01';
    }
    pthread_mutex_unlock((pthread_mutex_t *)&s_InitLock);
  }
  iVar1 = std::
          _Rb_tree<ASDCP::UL,_std::pair<const_ASDCP::UL,_ASDCP::MXF::InterchangeObject_*(*)(const_ASDCP::Dictionary_*)>,_std::_Select1st<std::pair<const_ASDCP::UL,_ASDCP::MXF::InterchangeObject_*(*)(const_ASDCP::Dictionary_*)>_>,_ASDCP::MXF::FactoryCompareUL,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::MXF::InterchangeObject_*(*)(const_ASDCP::Dictionary_*)>_>_>
          ::find((_Rb_tree<ASDCP::UL,_std::pair<const_ASDCP::UL,_ASDCP::MXF::InterchangeObject_*(*)(const_ASDCP::Dictionary_*)>,_std::_Select1st<std::pair<const_ASDCP::UL,_ASDCP::MXF::InterchangeObject_*(*)(const_ASDCP::Dictionary_*)>_>,_ASDCP::MXF::FactoryCompareUL,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::MXF::InterchangeObject_*(*)(const_ASDCP::Dictionary_*)>_>_>
                  *)&s_FactoryList,label);
  if ((_Rb_tree_header *)iVar1._M_node !=
      &s_FactoryList.super_FactoryMap_t._M_t._M_impl.super__Rb_tree_header) {
    pIVar2 = (InterchangeObject *)(**(code **)(iVar1._M_node + 2))(Dict);
    return pIVar2;
  }
  pIVar2 = (InterchangeObject *)operator_new(0xa0);
  InterchangeObject::InterchangeObject(pIVar2,Dict);
  return pIVar2;
}

Assistant:

ASDCP::MXF::InterchangeObject*
ASDCP::MXF::CreateObject(const Dictionary* Dict, const UL& label)
{
  if ( ! s_TypesInit )
    {
      Kumu::AutoMutex BlockLock(s_InitLock);

      if ( ! s_TypesInit )
	{
	  MXF::Metadata_InitTypes(Dict);
	  s_TypesInit = true;
	}
    }

  FLi_t i = s_FactoryList.find(label);

  if ( i == s_FactoryList.end() )
    return new InterchangeObject(Dict);

  return i->second(Dict);
}